

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

long __thiscall tetgenmesh::removeslivers(tetgenmesh *this,int chkencflag)

{
  tetrahedron *pppdVar1;
  point pdVar2;
  int iVar3;
  arraypool *paVar4;
  badface *searchtet;
  bool bVar5;
  uint local_b0;
  int local_ac;
  int k;
  int j;
  int i;
  int iter;
  long sptcount;
  long totalsptcount;
  double maxcosd;
  double cosdd [6];
  point *ppt;
  triface *parytet;
  triface slitet;
  badface *parybface;
  badface *bface;
  arraypool *swapqueue;
  arraypool *flipqueue;
  int chkencflag_local;
  tetgenmesh *this_local;
  
  triface::triface((triface *)&parytet);
  paVar4 = (arraypool *)operator_new(0x30);
  arraypool::arraypool(paVar4,0x88,10);
  swapqueue = this->unflipqueue;
  this->unflipqueue = paVar4;
  sptcount = 0;
  j = 0;
  while( true ) {
    bVar5 = false;
    if (0 < swapqueue->objects) {
      bVar5 = this->steinerleft != 0;
    }
    if (!bVar5) break;
    _i = 0;
    if (1 < this->b->verbose) {
      printf("    Splitting bad quality tets [%d]#:  %ld.\n",(ulong)(uint)j,swapqueue->objects);
    }
    local_b0 = 0;
    while( true ) {
      bVar5 = false;
      if ((long)(int)local_b0 < swapqueue->objects) {
        bVar5 = this->steinerleft != 0;
      }
      if (!bVar5) break;
      searchtet = (badface *)
                  (swapqueue->toparray
                   [(int)local_b0 >> ((byte)swapqueue->log2objectsperblock & 0x1f)] +
                  (int)((local_b0 & swapqueue->objectsperblockmark) * swapqueue->objectbytes));
      iVar3 = gettetrahedron(this,searchtet->forg,searchtet->fdest,searchtet->fapex,searchtet->foppo
                             ,(triface *)searchtet);
      if (iVar3 != 0) {
        if (((searchtet->key == 0.0) && (!NAN(searchtet->key))) || ((searchtet->tt).ver != 0xb)) {
          pppdVar1 = (searchtet->tt).tet;
          cosdd[5] = (double)(pppdVar1 + 4);
          tetalldihedral(this,(point)*(tetrahedron *)cosdd[5],(point)pppdVar1[5],(point)pppdVar1[6],
                         (point)pppdVar1[7],searchtet->cent,&searchtet->key,(double *)0x0);
        }
        if (searchtet->key < this->cosslidihed) {
          parytet = (triface *)(searchtet->tt).tet;
          for (local_ac = 0; local_ac < 6; local_ac = local_ac + 1) {
            if (searchtet->cent[local_ac] < this->cosslidihed) {
              slitet.tet._0_4_ = edge2ver[local_ac];
              iVar3 = splitsliver(this,(triface *)&parytet,searchtet->cent[local_ac],chkencflag);
              if (iVar3 != 0) {
                _i = _i + 1;
                break;
              }
            }
          }
          if (local_ac < 6) {
            memorypool::traversalinit(this->badtetrahedrons);
            ppt = (point *)memorypool::traverse(this->badtetrahedrons);
            while (ppt != (point *)0x0) {
              unmarktest2(this,(triface *)ppt);
              pdVar2 = *ppt;
              cosdd[5] = (double)(pdVar2 + 4);
              tetalldihedral(this,*(point *)cosdd[5],(point)pdVar2[5],(point)pdVar2[6],
                             (point)pdVar2[7],&maxcosd,(double *)&totalsptcount,(double *)0x0);
              if ((double)totalsptcount < this->cosslidihed) {
                arraypool::newindex(this->unflipqueue,(void **)&slitet.ver);
                *(undefined8 *)(slitet._8_8_ + 0x58) = *(undefined8 *)cosdd[5];
                *(undefined8 *)(slitet._8_8_ + 0x60) = *(undefined8 *)((long)cosdd[5] + 8);
                *(undefined8 *)(slitet._8_8_ + 0x68) = *(undefined8 *)((long)cosdd[5] + 0x10);
                *(undefined8 *)(slitet._8_8_ + 0x70) = *(undefined8 *)((long)cosdd[5] + 0x18);
                *(point *)slitet._8_8_ = *ppt;
                *(undefined4 *)(slitet._8_8_ + 8) = 0xb;
                *(long *)(slitet._8_8_ + 0x20) = totalsptcount;
                for (k = 0; k < 6; k = k + 1) {
                  *(double *)(slitet._8_8_ + 0x28 + (long)k * 8) = cosdd[(long)k + -1];
                }
              }
              ppt = (point *)memorypool::traverse(this->badtetrahedrons);
            }
            memorypool::restart(this->badtetrahedrons);
          }
          else {
            arraypool::newindex(this->unflipqueue,(void **)&slitet.ver);
            badface::operator=((badface *)slitet._8_8_,searchtet);
          }
        }
      }
      local_b0 = local_b0 + 1;
    }
    arraypool::restart(swapqueue);
    if (1 < this->b->verbose) {
      printf("    Split %ld tets.\n",_i);
    }
    sptcount = _i + sptcount;
    if ((_i == 0) || (j = j + 1, j == 2)) break;
    paVar4 = this->unflipqueue;
    this->unflipqueue = swapqueue;
    swapqueue = paVar4;
  }
  if (swapqueue != (arraypool *)0x0) {
    arraypool::~arraypool(swapqueue);
    operator_delete(swapqueue,0x30);
  }
  return sptcount;
}

Assistant:

long tetgenmesh::removeslivers(int chkencflag)
{
  arraypool *flipqueue, *swapqueue;
  badface *bface, *parybface;
  triface slitet, *parytet;
  point *ppt;
  REAL cosdd[6], maxcosd;
  long totalsptcount, sptcount;
  int iter, i, j, k;

  //assert(unflipqueue->objects > 0l);
  flipqueue = new arraypool(sizeof(badface), 10);

  // Swap the two flip queues.
  swapqueue = flipqueue;
  flipqueue = unflipqueue;
  unflipqueue = swapqueue;

  totalsptcount = 0l;
  iter = 0;

  while ((flipqueue->objects > 0l) && (steinerleft != 0)) {

    sptcount = 0l;

    if (b->verbose > 1) {
      printf("    Splitting bad quality tets [%d]#:  %ld.\n",
             iter, flipqueue->objects);
    }

    for (k = 0; (k < flipqueue->objects) && (steinerleft != 0); k++) {      
      bface  = (badface *) fastlookup(flipqueue, k);
      if (gettetrahedron(bface->forg, bface->fdest, bface->fapex,
                         bface->foppo, &bface->tt)) {
        if ((bface->key == 0) || (bface->tt.ver != 11)) {
          // Here we need to re-compute the quality. Since other smoothing
          //   operation may have moved the vertices of this tet.
          ppt = (point *) & (bface->tt.tet[4]);
          tetalldihedral(ppt[0], ppt[1], ppt[2], ppt[3], bface->cent, 
                         &bface->key, NULL);
        }
        if (bface->key < cosslidihed) { 
          // It is a sliver. Try to split it.
          slitet.tet = bface->tt.tet;
          //cosdd = bface->cent;
          for (j = 0; j < 6; j++) {
            if (bface->cent[j] < cosslidihed) { 
              // Found a large dihedral angle.
              slitet.ver = edge2ver[j]; // Go to the edge.
              if (splitsliver(&slitet, bface->cent[j], chkencflag)) {
                sptcount++;
                break;
              }
            }
          } // j
          if (j < 6) {
            // A sliver is split. Queue new slivers.
            badtetrahedrons->traversalinit();
            parytet = (triface *) badtetrahedrons->traverse();
            while (parytet != NULL) {
              unmarktest2(*parytet);
              ppt = (point *) & (parytet->tet[4]);
              tetalldihedral(ppt[0], ppt[1], ppt[2], ppt[3], cosdd, 
                             &maxcosd, NULL);
              if (maxcosd < cosslidihed) {
                // A new sliver. Queue it.
                unflipqueue->newindex((void **) &parybface);
                parybface->forg = ppt[0];
                parybface->fdest = ppt[1];
                parybface->fapex = ppt[2];
                parybface->foppo = ppt[3];
                parybface->tt.tet = parytet->tet;
                parybface->tt.ver = 11;
                parybface->key = maxcosd;
                for (i = 0; i < 6; i++) {
                  parybface->cent[i] = cosdd[i];
                }
              }
              parytet = (triface *) badtetrahedrons->traverse();
            }
            badtetrahedrons->restart();
          } else {
            // Didn't split. Queue it again.
            unflipqueue->newindex((void **) &parybface);
            *parybface = *bface;
          } // if (j == 6)
        } // if (bface->key < cosslidihed)
      } // if (gettetrahedron(...))
    } // k

    flipqueue->restart();

    if (b->verbose > 1) {
      printf("    Split %ld tets.\n", sptcount);
    }
    totalsptcount += sptcount;

    if (sptcount == 0l) {
      // No point has been smoothed. 
      break;
    } else {
      iter++;
      if (iter == 2) { //if (iter >= b->optpasses) {
        break;
      }
    }

    // Swap the two flip queues.
    swapqueue = flipqueue;
    flipqueue = unflipqueue;
    unflipqueue = swapqueue;
  } // while

  delete flipqueue;

  return totalsptcount;
}